

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O1

void __thiscall pager::~pager(pager *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  r_memory_map::~r_memory_map(&this->_mm);
  r_file::~r_file(&this->_f);
  pcVar1 = (this->_fileName)._M_dataplus._M_p;
  paVar2 = &(this->_fileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

pager::~pager() noexcept
{
}